

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poly.cpp
# Opt level: O0

bool __thiscall MT32Emu::Poly::startAbort(Poly *this)

{
  bool bVar1;
  Synth *pSVar2;
  Partial *partial;
  int t;
  Poly *this_local;
  
  if (this->state != POLY_Inactive) {
    pSVar2 = Part::getSynth(this->part);
    bVar1 = Synth::isAbortingPoly(pSVar2);
    if (!bVar1) {
      for (partial._4_4_ = 0; partial._4_4_ < 4; partial._4_4_ = partial._4_4_ + 1) {
        if (this->partials[partial._4_4_] != (Partial *)0x0) {
          Partial::startAbort(this->partials[partial._4_4_]);
          pSVar2 = Part::getSynth(this->part);
          pSVar2->abortingPoly = this;
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool Poly::startAbort() {
	if (state == POLY_Inactive || part->getSynth()->isAbortingPoly()) {
		return false;
	}
	for (int t = 0; t < 4; t++) {
		Partial *partial = partials[t];
		if (partial != NULL) {
			partial->startAbort();
			part->getSynth()->abortingPoly = this;
		}
	}
	return true;
}